

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

int GetSystemCPUsCount(void)

{
  long lVar1;
  long rv;
  
  lVar1 = sysconf(0x54);
  if (lVar1 < 0) {
    rv._4_4_ = 1;
  }
  else {
    rv._4_4_ = (int)lVar1;
  }
  return rv._4_4_;
}

Assistant:

int GetSystemCPUsCount()
{
#if defined(PLATFORM_WINDOWS)
  // Get the number of processors.
  SYSTEM_INFO info;
  GetSystemInfo(&info);
  return  info.dwNumberOfProcessors;
#else
  long rv = sysconf(_SC_NPROCESSORS_ONLN);
  if (rv < 0) {
    return 1;
  }
  return static_cast<int>(rv);
#endif
}